

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCntAutoPtr.hpp
# Opt level: O2

void __thiscall
Diligent::RefCntAutoPtr<Diligent::ThreadPoolImpl>::RefCntAutoPtr
          (RefCntAutoPtr<Diligent::ThreadPoolImpl> *this,ThreadPoolImpl *pObj)

{
  this->m_pObject = pObj;
  if (pObj != (ThreadPoolImpl *)0x0) {
    RefCountedObject<Diligent::IThreadPool>::AddRef((RefCountedObject<Diligent::IThreadPool> *)pObj)
    ;
  }
  return;
}

Assistant:

explicit RefCntAutoPtr(T* pObj) noexcept :
        m_pObject{pObj}
    {
        if (m_pObject)
            m_pObject->AddRef();
    }